

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_decrypt_address_token
              (ptls_aead_context_t *aead,quicly_address_token_plaintext_t *plaintext,void *_token,
              size_t len,size_t prefix_len,char **err_desc)

{
  ptls_iovec_t src_00;
  ptls_iovec_t src_01;
  ptls_iovec_t src_02;
  uint16_t uVar1;
  uint uVar2;
  uint8_t *end_00;
  size_t sVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong in_RCX;
  long in_RDX;
  byte *pbVar6;
  int *in_RSI;
  long *in_RDI;
  long in_R8;
  long *in_R9;
  uint8_t *end_6;
  uint8_t *_src_5;
  uint64_t _block_size64_5;
  size_t _block_size_5;
  size_t _capacity_5;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint16_t port;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  in_port_t *portaddr;
  uint8_t *end;
  uint8_t *src;
  int ret;
  size_t ptlen;
  uint8_t ptbuf [1200];
  uint8_t *token;
  uint8_t **in_stack_fffffffffffff980;
  uint64_t *in_stack_fffffffffffff988;
  void *in_stack_fffffffffffff990;
  void *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  undefined4 in_stack_fffffffffffff9b0;
  ulong local_630;
  long local_628;
  ulong local_608;
  long local_600;
  ulong local_5d0;
  long local_5c8;
  ulong local_598;
  long local_590;
  ulong local_560;
  long local_558;
  uint16_t local_54a;
  ulong local_530;
  long local_528;
  uint16_t *local_520;
  byte *local_510;
  int local_504;
  byte local_4f8 [1216];
  long *local_38;
  long local_30;
  int *local_18;
  long *local_10;
  
  *in_R9 = 0;
  if (in_RCX < (ulong)(in_R8 + 1 + *(long *)(*in_RDI + 0x30) + *(long *)(*in_RDI + 0x38))) {
    *in_R9 = (long)"token too small";
    return 0x32;
  }
  if ((ulong)(in_R8 + *(long *)(*in_RDI + 0x30) + 0x4b1 + *(long *)(*in_RDI + 0x38)) < in_RCX) {
    *in_R9 = (long)"token too large";
    return 0x32;
  }
  uVar2 = (uint)*(byte *)(in_RDX + in_R8);
  if (uVar2 == 0) {
    *in_RSI = 0;
  }
  else {
    if (uVar2 != 1) {
      *in_R9 = (long)"unknown token type";
      return 0x32;
    }
    *in_RSI = 1;
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  (**(code **)(*in_RDI + 0x48))(in_RDI,0,0,in_RDX + in_R8 + 1);
  end_00 = (uint8_t *)(local_30 + 1 + *(long *)(*local_10 + 0x30));
  sVar3 = ptls_aead_decrypt((ptls_aead_context_t *)
                            CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                            in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                            (size_t)in_stack_fffffffffffff988,(uint64_t)in_stack_fffffffffffff980,
                            end_00,CONCAT44(uVar2,in_stack_fffffffffffff9b0));
  if (sVar3 == 0xffffffffffffffff) {
    local_504 = 0x33;
    *local_38 = (long)"token decryption failure";
  }
  else {
    pbVar4 = local_4f8 + sVar3;
    local_504 = ptls_decode64(in_stack_fffffffffffff988,in_stack_fffffffffffff980,end_00);
    if (local_504 == 0) {
      local_528 = 1;
      if (pbVar4 == local_4f8) {
        local_504 = 0x32;
      }
      else {
        local_530 = 0;
        pbVar6 = local_4f8;
        do {
          local_510 = pbVar6;
          pbVar6 = local_510 + 1;
          local_530 = local_530 << 8 | (ulong)*local_510;
          local_528 = local_528 + -1;
        } while (local_528 != 0);
        if ((ulong)((long)pbVar4 - (long)pbVar6) < local_530) {
          local_504 = 0x32;
        }
        else {
          pbVar5 = pbVar6 + local_530;
          if ((long)pbVar5 - (long)pbVar6 == 4) {
            *(undefined2 *)(local_18 + 0xb) = 2;
            local_18[0xc] = *(int *)pbVar6;
          }
          else {
            if ((long)pbVar5 - (long)pbVar6 != 0x10) {
              local_504 = 0x32;
              goto LAB_0014414a;
            }
            *(undefined2 *)(local_18 + 0xb) = 10;
            *(undefined8 *)(local_18 + 0xd) = *(undefined8 *)pbVar6;
            *(undefined8 *)(local_18 + 0xf) = *(undefined8 *)(local_510 + 9);
          }
          local_520 = (uint16_t *)((long)local_18 + 0x2e);
          local_504 = ptls_decode16((uint16_t *)in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                                    end_00);
          if (local_504 == 0) {
            uVar1 = htons(local_54a);
            *local_520 = uVar1;
            if (*local_18 == 0) {
              local_558 = 1;
              if (pbVar4 == pbVar5) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              local_560 = 0;
              local_510 = pbVar5;
              do {
                pbVar6 = local_510 + 1;
                local_560 = local_560 << 8 | (ulong)*local_510;
                local_558 = local_558 + -1;
                local_510 = pbVar6;
              } while (local_558 != 0);
              if ((ulong)((long)pbVar4 - (long)pbVar6) < local_560) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              local_510 = pbVar6 + local_560;
              if (0x14 < (ulong)((long)local_510 - (long)pbVar6)) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              ptls_iovec_init(pbVar6,(long)local_510 - (long)pbVar6);
              src_00.len = (size_t)in_stack_fffffffffffff980;
              src_00.base = end_00;
              quicly_set_cid((quicly_cid_t *)0x143940,src_00);
              local_590 = 1;
              if (pbVar4 == local_510) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              local_598 = 0;
              do {
                pbVar6 = local_510 + 1;
                local_598 = local_598 << 8 | (ulong)*local_510;
                local_590 = local_590 + -1;
                local_510 = pbVar6;
              } while (local_590 != 0);
              if ((ulong)((long)pbVar4 - (long)pbVar6) < local_598) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              local_510 = pbVar6 + local_598;
              if (0x14 < (ulong)((long)local_510 - (long)pbVar6)) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              ptls_iovec_init(pbVar6,(long)local_510 - (long)pbVar6);
              src_01.len = (size_t)in_stack_fffffffffffff980;
              src_01.base = end_00;
              quicly_set_cid((quicly_cid_t *)0x143b56,src_01);
              local_5c8 = 1;
              if (pbVar4 == local_510) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              local_5d0 = 0;
              do {
                pbVar6 = local_510 + 1;
                local_5d0 = local_5d0 << 8 | (ulong)*local_510;
                local_5c8 = local_5c8 + -1;
                local_510 = pbVar6;
              } while (local_5c8 != 0);
              if ((ulong)((long)pbVar4 - (long)pbVar6) < local_5d0) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              local_510 = pbVar6 + local_5d0;
              if (0x14 < (ulong)((long)local_510 - (long)pbVar6)) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              ptls_iovec_init(pbVar6,(long)local_510 - (long)pbVar6);
              src_02.len = (size_t)in_stack_fffffffffffff980;
              src_02.base = end_00;
              quicly_set_cid((quicly_cid_t *)0x143d6c,src_02);
            }
            else {
              if (*local_18 != 1) {
                __assert_fail("!\"unexpected token type\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                              ,0x185d,
                              "int quicly_decrypt_address_token(ptls_aead_context_t *, quicly_address_token_plaintext_t *, const void *, size_t, size_t, const char **)"
                             );
              }
              local_600 = 1;
              if (pbVar4 == pbVar5) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              local_608 = 0;
              local_510 = pbVar5;
              do {
                pbVar6 = local_510 + 1;
                local_608 = local_608 << 8 | (ulong)*local_510;
                local_600 = local_600 + -1;
                local_510 = pbVar6;
              } while (local_600 != 0);
              if ((ulong)((long)pbVar4 - (long)pbVar6) < local_608) {
                local_504 = 0x32;
                goto LAB_0014414a;
              }
              local_510 = pbVar6 + local_608;
              *(long *)(local_18 + 0x52) = (long)local_510 - (long)pbVar6;
              memcpy(local_18 + 0x12,pbVar6,*(size_t *)(local_18 + 0x52));
            }
            local_628 = 1;
            if (pbVar4 == local_510) {
              local_504 = 0x32;
            }
            else {
              local_630 = 0;
              do {
                pbVar6 = local_510 + 1;
                local_630 = local_630 << 8 | (ulong)*local_510;
                local_628 = local_628 + -1;
                local_510 = pbVar6;
              } while (local_628 != 0);
              if ((ulong)((long)pbVar4 - (long)pbVar6) < local_630) {
                local_504 = 0x32;
              }
              else {
                *(long *)(local_18 + 0x94) = (long)(pbVar6 + local_630) - (long)pbVar6;
                memcpy(local_18 + 0x54,pbVar6,*(size_t *)(local_18 + 0x94));
                if (pbVar6 + local_630 == pbVar4) {
                  local_504 = 0;
                }
                else {
                  local_504 = 0x32;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0014414a:
  if (local_504 != 0) {
    if (*local_38 == 0) {
      *local_38 = (long)"token decode error";
    }
    if (*local_18 == 0) {
      local_504 = 0x2000b;
    }
  }
  return local_504;
}

Assistant:

int quicly_decrypt_address_token(ptls_aead_context_t *aead, quicly_address_token_plaintext_t *plaintext, const void *_token,
                                 size_t len, size_t prefix_len, const char **err_desc)
{
    const uint8_t *const token = _token;
    uint8_t ptbuf[QUICLY_MIN_CLIENT_INITIAL_SIZE];
    size_t ptlen;

    *err_desc = NULL;

    /* check if we can get type and decrypt */
    if (len < prefix_len + 1 + aead->algo->iv_size + aead->algo->tag_size) {
        *err_desc = "token too small";
        return PTLS_ALERT_DECODE_ERROR;
    }
    if (prefix_len + 1 + aead->algo->iv_size + sizeof(ptbuf) + aead->algo->tag_size < len) {
        *err_desc = "token too large";
        return PTLS_ALERT_DECODE_ERROR;
    }

    /* check type */
    switch (token[prefix_len]) {
    case QUICLY_ADDRESS_TOKEN_TYPE_RETRY:
        plaintext->type = QUICLY_ADDRESS_TOKEN_TYPE_RETRY;
        break;
    case QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION:
        plaintext->type = QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION;
        break;
    default:
        *err_desc = "unknown token type";
        return PTLS_ALERT_DECODE_ERROR;
    }

    /* `goto Exit` can only happen below this line, and that is guaranteed by declaring `ret` here */
    int ret;

    /* decrypt */
    aead->algo->setup_crypto(aead, 0, NULL, token + prefix_len + 1);
    if ((ptlen = ptls_aead_decrypt(aead, ptbuf, token + prefix_len + 1 + aead->algo->iv_size,
                                   len - (prefix_len + 1 + aead->algo->iv_size), 0, token, prefix_len + 1 + aead->algo->iv_size)) ==
        SIZE_MAX) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        *err_desc = "token decryption failure";
        goto Exit;
    }

    /* parse */
    const uint8_t *src = ptbuf, *end = src + ptlen;
    if ((ret = ptls_decode64(&plaintext->issued_at, &src, end)) != 0)
        goto Exit;
    {
        in_port_t *portaddr;
        ptls_decode_open_block(src, end, 1, {
            switch (end - src) {
            case 4: /* ipv4 */
                plaintext->remote.sin.sin_family = AF_INET;
                memcpy(&plaintext->remote.sin.sin_addr.s_addr, src, 4);
                portaddr = &plaintext->remote.sin.sin_port;
                break;
            case 16: /* ipv6 */
                plaintext->remote.sin6.sin6_family = AF_INET6;
                memcpy(&plaintext->remote.sin6.sin6_addr, src, 16);
                portaddr = &plaintext->remote.sin6.sin6_port;
                break;
            default:
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            src = end;
        });
        uint16_t port;
        if ((ret = ptls_decode16(&port, &src, end)) != 0)
            goto Exit;
        *portaddr = htons(port);
    }
    switch (plaintext->type) {
    case QUICLY_ADDRESS_TOKEN_TYPE_RETRY:
#define DECODE_CID(field)                                                                                                          \
    do {                                                                                                                           \
        ptls_decode_open_block(src, end, 1, {                                                                                      \
            if (end - src > sizeof(plaintext->retry.field.cid)) {                                                                  \
                ret = PTLS_ALERT_DECODE_ERROR;                                                                                     \
                goto Exit;                                                                                                         \
            }                                                                                                                      \
            quicly_set_cid(&plaintext->retry.field, ptls_iovec_init(src, end - src));                                              \
            src = end;                                                                                                             \
        });                                                                                                                        \
    } while (0)
        DECODE_CID(original_dcid);
        DECODE_CID(client_cid);
        DECODE_CID(server_cid);
#undef DECODE_CID
        break;
    case QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION:
        ptls_decode_open_block(src, end, 1, {
            PTLS_BUILD_ASSERT(sizeof(plaintext->resumption.bytes) >= 256);
            plaintext->resumption.len = end - src;
            memcpy(plaintext->resumption.bytes, src, plaintext->resumption.len);
            src = end;
        });
        break;
    default:
        assert(!"unexpected token type");
        abort();
    }
    ptls_decode_block(src, end, 1, {
        PTLS_BUILD_ASSERT(sizeof(plaintext->appdata.bytes) >= 256);
        plaintext->appdata.len = end - src;
        memcpy(plaintext->appdata.bytes, src, plaintext->appdata.len);
        src = end;
    });
    ret = 0;

Exit:
    if (ret != 0) {
        if (*err_desc == NULL)
            *err_desc = "token decode error";
        /* promote the error to one that triggers the emission of INVALID_TOKEN_ERROR, if the token looked like a retry */
        if (plaintext->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY)
            ret = QUICLY_TRANSPORT_ERROR_INVALID_TOKEN;
    }
    return ret;
}